

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void drawnumber_motionfn(void *z,t_floatarg dx,t_floatarg dy,t_floatarg up)

{
  t_template *template;
  _glist *owner;
  t_scalar *sc;
  int iVar1;
  t_symbol *s;
  undefined1 local_38 [8];
  t_atom at;
  t_drawnumber *x;
  t_floatarg up_local;
  t_floatarg dy_local;
  t_floatarg dx_local;
  void *z_local;
  
  if ((up == 0.0) && (!NAN(up))) {
    at.a_w = (word)z;
    iVar1 = gpointer_check((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0xf0),0);
    if (iVar1 == 0) {
      post("drawnumber_motion: scalar disappeared");
    }
    else if (*(int *)((pd_maininstance.pd_gui)->i_template + 0x108) == 0) {
      *(float *)((pd_maininstance.pd_gui)->i_template + 0xc0) =
           *(float *)((pd_maininstance.pd_gui)->i_template + 0xc0) - dy;
      template_setfloat(*(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe8),
                        (t_symbol *)((at.a_w.w_array)->a_gp).gp_stub,
                        *(t_word **)((pd_maininstance.pd_gui)->i_template + 0xe0),
                        *(t_float *)((pd_maininstance.pd_gui)->i_template + 0xc0),1);
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0xd0) != 0) {
        template = *(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe8);
        owner = *(_glist **)((pd_maininstance.pd_gui)->i_template + 200);
        sc = *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0xd0);
        s = gensym("change");
        template_notifyforscalar(template,owner,sc,s,1,(t_atom *)local_38);
      }
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0xd0) != 0) {
        scalar_redraw(*(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0xd0),
                      *(_glist **)((pd_maininstance.pd_gui)->i_template + 200));
      }
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0xd8) != 0) {
        array_redraw(*(_array **)((pd_maininstance.pd_gui)->i_template + 0xd8),
                     *(_glist **)((pd_maininstance.pd_gui)->i_template + 200));
      }
    }
  }
  return;
}

Assistant:

static void drawnumber_motionfn(void *z, t_floatarg dx, t_floatarg dy,
    t_floatarg up)
{
    t_drawnumber *x = (t_drawnumber *)z;
    t_atom at;
    if (up != 0)
        return;
    if (!gpointer_check(&TEMPLATE->drawnumber_motion_gpointer, 0))
    {
        post("drawnumber_motion: scalar disappeared");
        return;
    }
    if (TEMPLATE->drawnumber_motion_type != DT_FLOAT)
        return;
    TEMPLATE->drawnumber_motion_ycumulative -= dy;
    template_setfloat(TEMPLATE->drawnumber_motion_template,
        x->x_fieldname,
            TEMPLATE->drawnumber_motion_wp,
            TEMPLATE->drawnumber_motion_ycumulative,
                1);
    if (TEMPLATE->drawnumber_motion_scalar)
        template_notifyforscalar(TEMPLATE->drawnumber_motion_template,
            TEMPLATE->drawnumber_motion_glist,
                TEMPLATE->drawnumber_motion_scalar,
                gensym("change"), 1, &at);

    if (TEMPLATE->drawnumber_motion_scalar)
        scalar_redraw(TEMPLATE->drawnumber_motion_scalar,
            TEMPLATE->drawnumber_motion_glist);
    if (TEMPLATE->drawnumber_motion_array)
        array_redraw(TEMPLATE->drawnumber_motion_array,
            TEMPLATE->drawnumber_motion_glist);
}